

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O3

void string_suite::test_view(void)

{
  long *plVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string data;
  writer writer;
  string_view view;
  size_type local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined4 local_ac;
  long *local_a8 [2];
  long local_98 [2];
  type local_88;
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  local_78;
  string_view_type local_28;
  
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_88.__align,&local_c8);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ABC","");
  plVar1 = local_a8[0];
  local_28._M_len = strlen((char *)local_a8[0]);
  local_28._M_str = (char *)plVar1;
  local_d0 = trial::protocol::bintoken::detail::basic_encoder<16UL>::value
                       ((basic_encoder<16UL> *)&local_88.__align,&local_28);
  local_ac = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(view)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x145,"void string_suite::test_view()",&local_d0,&local_ac);
  local_d0 = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_ac = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x146,"void string_suite::test_view()",&local_d0,&local_ac);
  local_d0._0_4_ = 0xa9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[0]","token::code::string8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x147,"void string_suite::test_view()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_d0);
  local_d0._0_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[1]","0x03",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x148,"void string_suite::test_view()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,&local_d0);
  local_d0._0_4_ = 0x41;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[2]","0x41",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x149,"void string_suite::test_view()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 2,&local_d0);
  local_d0._0_4_ = 0x42;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[3]","0x42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x14a,"void string_suite::test_view()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 3,&local_d0);
  local_d0 = CONCAT44(local_d0._4_4_,0x43);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[4]","0x43",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x14b,"void string_suite::test_view()",
             local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,&local_d0);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base(&local_78);
  (**(code **)local_88._0_8_)(&local_88);
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}